

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O3

void __thiscall
sptk::reaper::LpcAnalyzer::Durbin(LpcAnalyzer *this,float *r,float *k,float *a,int p,float *ex)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float bb [100];
  float local_1c8 [102];
  
  fVar8 = *r;
  fVar7 = -r[1] / fVar8;
  *k = fVar7;
  *a = fVar7;
  fVar8 = fVar8 * (1.0 - *k * *k);
  if (1 < p) {
    pfVar3 = r + 1;
    pfVar6 = local_1c8;
    uVar4 = 0;
    lVar5 = 1;
    do {
      fVar7 = 0.0;
      lVar2 = 0;
      pfVar1 = pfVar3;
      do {
        fVar7 = fVar7 - a[lVar2] * *pfVar1;
        lVar2 = lVar2 + 1;
        pfVar1 = pfVar1 + -1;
      } while (lVar5 != lVar2);
      fVar7 = (fVar7 - r[lVar5 + 1]) / fVar8;
      k[lVar5] = fVar7;
      a[lVar5] = fVar7;
      memcpy(local_1c8,a,uVar4 * 4 + 8);
      lVar2 = 0;
      pfVar1 = pfVar6;
      do {
        a[lVar2] = k[lVar5] * *pfVar1 + a[lVar2];
        lVar2 = lVar2 + 1;
        pfVar1 = pfVar1 + -1;
      } while (lVar5 != lVar2);
      fVar8 = fVar8 * (1.0 - k[lVar5] * k[lVar5]);
      uVar4 = uVar4 + 1;
      pfVar3 = pfVar3 + 1;
      pfVar6 = pfVar6 + 1;
      lVar5 = lVar5 + 1;
    } while (uVar4 != p - 1);
  }
  *ex = fVar8;
  return;
}

Assistant:

void LpcAnalyzer::Durbin(float* r, float* k, float* a, int p, float* ex) {
  float  bb[BIGSORD];
  int i, j;
  float e, s, *b = bb;

  e = *r;
  *k = -r[1] / e;
  *a = *k;
  e *= (1.0 - (*k) * (*k));
  for (i = 1; i < p; i++) {
    s = 0;
    for (j = 0; j < i; j++) {
      s -= a[j] * r[i - j];
    }
    k[i] = (s - r[i + 1]) / e;
    a[i] = k[i];
    for (j = 0; j <= i; j++) {
      b[j] = a[j];
    }
    for (j = 0; j < i; j++) {
      a[j] += k[i] * b[i - j - 1];
    }
    e *= (1.0 - (k[i] * k[i]));
  }
  *ex = e;
}